

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyorigin.h
# Opt level: O2

bool operator<(KeyOriginInfo *a,KeyOriginInfo *b)

{
  long lVar1;
  __synth3way_t<unsigned_int> _Var2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = memcmp(a,b,4);
  bVar3 = true;
  if (iVar4 < 0) goto LAB_003238fe;
  if (iVar4 == 0) {
    uVar5 = (long)(a->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(a->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    uVar6 = (long)(b->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(b->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (uVar5 < uVar6) goto LAB_003238fe;
    if (uVar5 <= uVar6) {
      _Var2 = std::operator<=><unsigned_int,std::allocator<unsigned_int>>(&a->path,&b->path);
      bVar3 = (bool)((byte)_Var2._M_value >> 7);
      goto LAB_003238fe;
    }
  }
  bVar3 = false;
LAB_003238fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const KeyOriginInfo& a, const KeyOriginInfo& b)
    {
        // Compare the fingerprints lexicographically
        int fpr_cmp = memcmp(a.fingerprint, b.fingerprint, 4);
        if (fpr_cmp < 0) {
            return true;
        } else if (fpr_cmp > 0) {
            return false;
        }
        // Compare the sizes of the paths, shorter is "less than"
        if (a.path.size() < b.path.size()) {
            return true;
        } else if (a.path.size() > b.path.size()) {
            return false;
        }
        // Paths same length, compare them lexicographically
        return a.path < b.path;
    }